

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

String * kj::stringifyStackTrace(ArrayPtr<void_*const> trace)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  size_t sVar4;
  int iVar5;
  __pid_t _Var6;
  ExceptionCallback *pEVar7;
  char *pcVar8;
  size_t sVar9;
  FILE *__stream;
  char *pcVar10;
  _func_int **delim;
  char *delim_00;
  char *pcVar11;
  long in_RDX;
  size_t extraout_RDX;
  String *in_RDI;
  String *in_R9;
  long lVar12;
  bool bVar13;
  StringPtr filename;
  String oldPreload;
  String strTrace;
  char line [512];
  String lines [32];
  char *local_5c0;
  char *local_5b8;
  ulong uStack_5b0;
  ArrayDisposer *local_5a8;
  String local_598;
  char *local_578;
  String local_570;
  ArrayPtr<const_char> local_558;
  kj local_548 [15];
  kj kStack_539;
  char *local_538;
  char *pcStack_530;
  undefined8 *local_528;
  String local_338 [32];
  
  if (in_RDX == 0) {
LAB_001755fc:
    (in_RDI->content).ptr = (char *)0x0;
    (in_RDI->content).size_ = 0;
    (in_RDI->content).disposer = (ArrayDisposer *)0x0;
    return in_RDI;
  }
  pEVar7 = getExceptionCallback();
  delim = pEVar7->_vptr_ExceptionCallback;
  iVar5 = (*delim[5])(pEVar7);
  if (iVar5 != 0) goto LAB_001755fc;
  pthread_mutex_lock((pthread_mutex_t *)&stringifyStackTrace::mutex);
  pcVar8 = getenv("LD_PRELOAD");
  local_5b8 = (char *)0x0;
  uStack_5b0 = 0;
  local_5a8 = (ArrayDisposer *)0x0;
  if (pcVar8 != (char *)0x0) {
    sVar9 = strlen(pcVar8);
    heapString(local_338,pcVar8,sVar9);
    local_5b8 = local_338[0].content.ptr;
    uStack_5b0 = local_338[0].content.size_;
    local_5a8 = local_338[0].content.disposer;
    unsetenv("LD_PRELOAD");
  }
  memset(local_338,0,0x300);
  strArray<kj::ArrayPtr<void*const>&>
            (&local_598,local_548,(ArrayPtr<void_*const> *)0x19e8eb,(char *)delim);
  iVar5 = access("/proc/self/exe",4);
  if (-1 < iVar5) {
    _Var6 = getpid();
    local_570.content.ptr = (char *)CONCAT44(local_570.content.ptr._4_4_,_Var6);
    delim_00 = "/exe ";
    pcVar8 = (char *)&local_598;
    str<char_const(&)[20],int,char_const(&)[6],kj::String&>
              ((String *)&local_538,(kj *)"addr2line -e /proc/",(char (*) [20])&local_570,
               (int *)"/exe ",(char (*) [6])pcVar8,in_R9);
    pcVar10 = local_538;
    if (pcStack_530 == (char *)0x0) {
      pcVar10 = "";
    }
    __stream = popen(pcVar10,"r");
    pcVar11 = pcStack_530;
    pcVar10 = local_538;
    if (local_538 != (char *)0x0) {
      local_538 = (char *)0x0;
      pcStack_530 = (char *)0x0;
      pcVar8 = pcVar11;
      (**(code **)*local_528)(local_528,pcVar10,1,pcVar11,pcVar11,0);
      delim_00 = pcVar11;
    }
    if (__stream != (FILE *)0x0) {
      bVar13 = true;
      local_5c0 = (char *)0x0;
      do {
        while( true ) {
          pcVar10 = fgets((char *)&local_538,0x200,__stream);
          if (pcVar10 == (char *)0x0) goto LAB_00175920;
          pcVar10 = strstr((char *)&local_538,"kj/common.c++");
          if (((((pcVar10 == (char *)0x0) &&
                (pcVar10 = strstr((char *)&local_538,"kj/exception."), pcVar10 == (char *)0x0)) &&
               (pcVar10 = strstr((char *)&local_538,"kj/debug."), pcVar10 == (char *)0x0)) &&
              ((pcVar10 = strstr((char *)&local_538,"kj/async."), pcVar10 == (char *)0x0 &&
               (pcVar10 = strstr((char *)&local_538,"kj/async-prelude.h"), pcVar10 == (char *)0x0)))
              ) && ((pcVar10 = strstr((char *)&local_538,"kj/async-inl.h"), pcVar10 == (char *)0x0
                    && ((pcVar10 = strstr((char *)&local_538,"kj::Exception"),
                        pcVar10 == (char *)0x0 &&
                        (pcVar10 = strstr((char *)&local_538,"kj::_::Debug"), pcVar10 == (char *)0x0
                        )))))) break;
          if (!bVar13) goto LAB_00175920;
        }
        sVar9 = strlen((char *)&local_538);
        if ((sVar9 != 0) && (((kj *)&local_538)[sVar9 - 1] == (kj)0xa)) {
          (&kStack_539)[sVar9] = (kj)0x0;
        }
        sVar9 = strlen((char *)&local_538);
        filename.content.size_ = extraout_RDX;
        filename.content.ptr = (char *)(sVar9 + 1);
        local_558 = (ArrayPtr<const_char>)trimSourceFilename((kj *)&local_538,filename);
        str<char_const(&)[6],kj::StringPtr,char_const(&)[17]>
                  (&local_570,(kj *)"\n    ",(char (*) [6])&local_558,
                   (StringPtr *)": returning here",(char (*) [17])pcVar8);
        String::operator=(local_338 + (long)local_5c0,&local_570);
        local_578 = local_5c0 + 1;
        String::~String(&local_570);
        bVar13 = local_5c0 < (char *)0x1f;
        local_5c0 = local_578;
        delim_00 = local_578;
      } while (local_578 != (char *)0x20);
      local_5c0 = (char *)0x20;
LAB_00175920:
      do {
        pcVar8 = fgets((char *)&local_538,0x200,__stream);
      } while (pcVar8 != (char *)0x0);
      pclose(__stream);
      local_570.content.size_ = (size_t)local_5c0;
      local_570.content.ptr = (char *)local_338;
      strArray<kj::ArrayPtr<kj::String>>
                (in_RDI,(kj *)&local_570,(ArrayPtr<kj::String> *)0x1a0571,delim_00);
      goto LAB_0017597d;
    }
  }
  (in_RDI->content).ptr = (char *)0x0;
  (in_RDI->content).size_ = 0;
  (in_RDI->content).disposer = (ArrayDisposer *)0x0;
LAB_0017597d:
  sVar4 = local_598.content.size_;
  pcVar8 = local_598.content.ptr;
  if (local_598.content.ptr != (char *)0x0) {
    local_598.content.ptr = (char *)0x0;
    local_598.content.size_ = 0;
    (**(local_598.content.disposer)->_vptr_ArrayDisposer)
              (local_598.content.disposer,pcVar8,1,sVar4,sVar4,0);
  }
  lVar12 = 0x2e8;
  do {
    lVar1 = *(long *)((long)&local_338[0].content.ptr + lVar12);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_338[0].content.size_ + lVar12);
      *(undefined8 *)((long)&local_338[0].content.ptr + lVar12) = 0;
      *(undefined8 *)((long)&local_338[0].content.size_ + lVar12) = 0;
      puVar3 = *(undefined8 **)((long)&local_338[0].content.disposer + lVar12);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  if (1 < uStack_5b0) {
    setenv("LD_PRELOAD",local_5b8,1);
  }
  if (local_5b8 != (char *)0x0) {
    (**local_5a8->_vptr_ArrayDisposer)(local_5a8,local_5b8,1,uStack_5b0,uStack_5b0,0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&stringifyStackTrace::mutex);
  return in_RDI;
}

Assistant:

String stringifyStackTrace(ArrayPtr<void* const> trace) {
  if (trace.size() == 0) return nullptr;
  if (getExceptionCallback().stackTraceMode() != ExceptionCallback::StackTraceMode::FULL) {
    return nullptr;
  }

#if _WIN32 && _M_X64 && _MSC_VER

  // Try to get file/line using SymGetLineFromAddr64(). We don't bother if we aren't on MSVC since
  // this requires MSVC debug info.
  //
  // TODO(someday): We could perhaps shell out to addr2line on MinGW.

  const Dbghelp& dbghelp = getDbghelp();
  if (dbghelp.symGetLineFromAddr64 == nullptr) return nullptr;

  HANDLE process = GetCurrentProcess();

  KJ_STACK_ARRAY(String, lines, trace.size(), 32, 32);

  for (auto i: kj::indices(trace)) {
    IMAGEHLP_LINE64 lineInfo;
    memset(&lineInfo, 0, sizeof(lineInfo));
    lineInfo.SizeOfStruct = sizeof(lineInfo);
    if (dbghelp.symGetLineFromAddr64(process, reinterpret_cast<DWORD64>(trace[i]), NULL, &lineInfo)) {
      lines[i] = kj::str('\n', lineInfo.FileName, ':', lineInfo.LineNumber);
    }
  }

  return strArray(lines, "");

#elif (__linux__ || __APPLE__) && !__ANDROID__
  // We want to generate a human-readable stack trace.

  // TODO(someday):  It would be really great if we could avoid farming out to another process
  //   and do this all in-process, but that may involve onerous requirements like large library
  //   dependencies or using -rdynamic.

  // The environment manipulation is not thread-safe, so lock a mutex.  This could still be
  // problematic if another thread is manipulating the environment in unrelated code, but there's
  // not much we can do about that.  This is debug-only anyway and only an issue when LD_PRELOAD
  // is in use.
  static pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
  pthread_mutex_lock(&mutex);
  KJ_DEFER(pthread_mutex_unlock(&mutex));

  // Don't heapcheck / intercept syscalls.
  const char* preload = getenv("LD_PRELOAD");
  String oldPreload;
  if (preload != nullptr) {
    oldPreload = heapString(preload);
    unsetenv("LD_PRELOAD");
  }
  KJ_DEFER(if (oldPreload != nullptr) { setenv("LD_PRELOAD", oldPreload.cStr(), true); });

  String lines[32];
  FILE* p = nullptr;
  auto strTrace = strArray(trace, " ");

#if __linux__
  if (access("/proc/self/exe", R_OK) < 0) {
    // Apparently /proc is not available?
    return nullptr;
  }

  // Obtain symbolic stack trace using addr2line.
  // TODO(cleanup): Use fork() and exec() or maybe our own Subprocess API (once it exists), to
  //   avoid depending on a shell.
  p = popen(str("addr2line -e /proc/", getpid(), "/exe ", strTrace).cStr(), "r");
#elif __APPLE__
  // The Mac OS X equivalent of addr2line is atos.
  // (Internally, it uses the private CoreSymbolication.framework library.)
  p = popen(str("xcrun atos -p ", getpid(), ' ', strTrace).cStr(), "r");
#endif

  if (p == nullptr) {
    return nullptr;
  }

  char line[512];
  size_t i = 0;
  while (i < kj::size(lines) && fgets(line, sizeof(line), p) != nullptr) {
    // Don't include exception-handling infrastructure or promise infrastructure in stack trace.
    // addr2line output matches file names; atos output matches symbol names.
    if (strstr(line, "kj/common.c++") != nullptr ||
        strstr(line, "kj/exception.") != nullptr ||
        strstr(line, "kj/debug.") != nullptr ||
        strstr(line, "kj/async.") != nullptr ||
        strstr(line, "kj/async-prelude.h") != nullptr ||
        strstr(line, "kj/async-inl.h") != nullptr ||
        strstr(line, "kj::Exception") != nullptr ||
        strstr(line, "kj::_::Debug") != nullptr) {
      continue;
    }

    size_t len = strlen(line);
    if (len > 0 && line[len-1] == '\n') line[len-1] = '\0';
    lines[i++] = str("\n    ", trimSourceFilename(line), ": returning here");
  }

  // Skip remaining input.
  while (fgets(line, sizeof(line), p) != nullptr) {}

  pclose(p);

  return strArray(arrayPtr(lines, i), "");

#else
  return nullptr;
#endif
}